

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O3

const_reference __thiscall
immutable::vector<int,_false,_6>::operator[](vector<int,_false,_6> *this,size_type_conflict index)

{
  rrb<int,_false,_6> *prVar1;
  long lVar2;
  uint uVar3;
  uint32_t uVar4;
  char *__function;
  uint uVar5;
  leaf_node<int,_false> *plVar6;
  long *plVar7;
  
  prVar1 = (this->_impl).ptr;
  if (prVar1 == (rrb<int,_false,_6> *)0x0) {
    __function = 
    "T *immutable::ref<immutable::rrb<int, false, 6>>::operator->() const [T = immutable::rrb<int, false, 6>]"
    ;
LAB_0014414f:
    __assert_fail("ptr != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                  ,0x71a,__function);
  }
  if (prVar1->cnt <= index) {
    __assert_fail("index < rrb->cnt",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                  ,0x7c3,
                  "const T &immutable::rrb_nth(const ref<rrb<T, atomic_ref_counting, N>> &, uint32_t) [T = int, atomic_ref_counting = false, N = 6]"
                 );
  }
  uVar5 = prVar1->cnt - prVar1->tail_len;
  uVar3 = index - uVar5;
  if (index < uVar5) {
    plVar6 = (leaf_node<int,_false> *)(prVar1->root).ptr;
    for (uVar4 = prVar1->shift; uVar4 != 0; uVar4 = uVar4 - 6) {
      uVar3 = index >> ((byte)uVar4 & 0x1f);
      if ((long *)plVar6->child == (long *)0x0) {
        plVar7 = (long *)((ulong)((uVar3 & 0x3f) << 3) + *(long *)(plVar6 + 1));
      }
      else {
        lVar2 = *(long *)plVar6->child;
        do {
          uVar5 = uVar3;
          uVar3 = uVar5 + 1;
        } while (*(uint *)(lVar2 + (ulong)uVar5 * 4) <= index);
        if (uVar5 + 1 != 1) {
          index = index - *(int *)(lVar2 + (ulong)(uVar5 - 1) * 4);
        }
        plVar7 = (long *)((ulong)uVar5 * 8 + *(long *)(plVar6 + 1));
      }
      plVar6 = (leaf_node<int,_false> *)*plVar7;
    }
    uVar3 = index & 0x3f;
  }
  else {
    plVar6 = (prVar1->tail).ptr;
    if (plVar6 == (leaf_node<int,_false> *)0x0) {
      __function = 
      "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
      ;
      goto LAB_0014414f;
    }
  }
  return plVar6->child + uVar3;
}

Assistant:

const_reference operator [] (size_type index) const
        {
        return rrb_nth(_impl, index);
        }